

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM483I.cpp
# Opt level: O1

void * IM483IThread(void *pParam)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  __time_t _Var6;
  size_t sVar7;
  uint uVar8;
  uint uVar9;
  long *plVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  uint uVar15;
  CHRONO chrono_sail_calibration;
  CHRONO chrono_period;
  char szTemp [256];
  IM483I im483i;
  char szSaveFilePath [256];
  timespec local_858;
  int local_848;
  int local_844;
  double local_840;
  timespec local_838;
  long local_828;
  long lStack_820;
  long local_818;
  long lStack_810;
  timespec local_808;
  int local_7f8;
  timespec local_7f0;
  long local_7e0;
  long lStack_7d8;
  long local_7d0;
  long lStack_7c8;
  timespec local_7c0;
  int local_7b0;
  char local_7a8 [264];
  IM483I local_6a0;
  char local_138 [264];
  
  memset(&local_6a0,0,0x568);
  iVar3 = clock_getres(4,&local_808);
  if ((iVar3 == 0) && (iVar3 = clock_gettime(4,&local_838), iVar3 == 0)) {
    local_7f8 = 0;
    local_828 = 0;
    lStack_820 = 0;
    local_818 = 0;
    lStack_810 = 0;
  }
  iVar3 = clock_getres(4,&local_7c0);
  if ((iVar3 == 0) && (iVar3 = clock_gettime(4,&local_7f0), iVar3 == 0)) {
    local_7b0 = 0;
    local_7e0 = 0;
    lStack_7d8 = 0;
    local_7d0 = 0;
    lStack_7c8 = 0;
  }
  iVar3 = 0x32;
  bVar1 = false;
  local_844 = 0;
  do {
    local_848 = iVar3;
    while( true ) {
      if (local_7b0 == 0) {
        clock_gettime(4,&local_858);
        local_7e0 = local_858.tv_sec;
        lStack_7d8 = local_858.tv_nsec;
        local_858.tv_sec =
             (local_858.tv_sec + local_7d0 + (local_858.tv_nsec + lStack_7c8) / 1000000000) -
             local_7f0.tv_sec;
        local_858.tv_nsec = (local_858.tv_nsec + lStack_7c8) % 1000000000 - local_7f0.tv_nsec;
        if (local_858.tv_nsec < 0) {
          local_858.tv_sec = local_858.tv_sec + local_858.tv_nsec / 1000000000 + -1;
          local_858.tv_nsec = local_858.tv_nsec % 1000000000 + 1000000000;
        }
        local_7d0 = local_858.tv_sec;
        lStack_7c8 = local_858.tv_nsec;
      }
      iVar4 = clock_getres(4,&local_7c0);
      if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_7f0), iVar4 == 0)) {
        local_7b0 = 0;
        local_7d0 = 0;
        lStack_7c8 = 0;
        local_7e0 = 0;
        lStack_7d8 = 0;
      }
      local_858.tv_sec = (long)iVar3 / 1000;
      local_858.tv_nsec = ((long)iVar3 % 1000) * 1000000;
      nanosleep(&local_858,(timespec *)0x0);
      iVar4 = local_848;
      if (bPauseIM483I == 0) break;
      if (bVar1) {
        puts("IM483I paused.");
        iVar4 = CloseRS232Port(&local_6a0.RS232Port);
        pcVar14 = "IM483I disconnection failed.";
        if (iVar4 == 0) {
          pcVar14 = "IM483I disconnected.";
        }
        puts(pcVar14);
      }
      if (bExit != 0) {
        bVar2 = true;
        goto LAB_001ca58a;
      }
      local_858.tv_sec = 0;
      local_858.tv_nsec = 100000000;
      bVar1 = false;
      nanosleep(&local_858,(timespec *)0x0);
    }
    if (bRestartIM483I != 0) {
      if (bVar1) {
        puts("Restarting a IM483I.");
        iVar3 = CloseRS232Port(&local_6a0.RS232Port);
        pcVar14 = "IM483I disconnection failed.";
        if (iVar3 == 0) {
          pcVar14 = "IM483I disconnected.";
        }
        puts(pcVar14);
      }
      bRestartIM483I = 0;
      bVar1 = false;
    }
    iVar3 = iVar4;
    if (bVar1) {
      bVar1 = true;
      if (((robid == 0x2000) || (robid == 0x8000)) || (robid == 0x4000)) {
        if (local_7f8 == 0) {
          clock_gettime(4,&local_858);
          local_858.tv_sec =
               (local_858.tv_sec + local_818 + (local_858.tv_nsec + lStack_810) / 1000000000) -
               local_838.tv_sec;
          local_858.tv_nsec = (local_858.tv_nsec + lStack_810) % 1000000000 - local_838.tv_nsec;
          if (local_858.tv_nsec < 0) {
            local_858.tv_sec = local_858.tv_sec + local_858.tv_nsec / 1000000000 + -1;
            local_858.tv_nsec = local_858.tv_nsec % 1000000000 + 1000000000;
          }
          plVar10 = &local_858.tv_nsec;
          _Var6 = local_858.tv_sec;
        }
        else {
          plVar10 = &lStack_810;
          _Var6 = local_818;
        }
        if (((sail_calibration_period < (double)*plVar10 / 1000000000.0 + (double)_Var6) ||
            (bCalibrateSail != 0 && bSailCalibrated == 0)) || (bForceSailCalibration != 0)) {
          if (((bCalibrateSail != 0) && (bSailCalibrated == 0)) && (bCheckRudder != 0)) {
            local_858.tv_sec = 7;
            local_858.tv_nsec = 0;
            nanosleep(&local_858,(timespec *)0x0);
          }
          bSailCalibrated = 0;
          iVar4 = CalibrateMotorIM483I(&local_6a0);
          if (iVar4 != 0) {
            puts("Connection to a IM483I lost.");
            bSailCalibrated = 0;
            iVar4 = CloseRS232Port(&local_6a0.RS232Port);
            if (iVar4 == 0) {
              pcVar14 = "IM483I disconnected.";
            }
            else {
              pcVar14 = "IM483I disconnection failed.";
            }
            puts(pcVar14);
            bVar1 = false;
            bVar2 = true;
            goto LAB_001ca448;
          }
          bSailCalibrated = 1;
          bForceSailCalibration = 0;
          if (local_7f8 == 0) {
            clock_gettime(4,&local_858);
            local_828 = local_858.tv_sec;
            lStack_820 = local_858.tv_nsec;
            local_858.tv_sec =
                 (local_858.tv_sec + local_818 + (local_858.tv_nsec + lStack_810) / 1000000000) -
                 local_838.tv_sec;
            local_858.tv_nsec = (local_858.tv_nsec + lStack_810) % 1000000000 - local_838.tv_nsec;
            if (local_858.tv_nsec < 0) {
              local_858.tv_sec = local_858.tv_sec + local_858.tv_nsec / 1000000000 + -1;
              local_858.tv_nsec = local_858.tv_nsec % 1000000000 + 1000000000;
            }
            local_818 = local_858.tv_sec;
            lStack_810 = local_858.tv_nsec;
          }
          iVar3 = clock_getres(4,&local_808);
          if ((iVar3 == 0) && (iVar3 = clock_gettime(4,&local_838), iVar3 == 0)) {
            local_7f8 = 0;
            local_818 = 0;
            lStack_810 = 0;
            local_828 = 0;
            lStack_820 = 0;
          }
        }
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        if (u_f <= 0.0) {
          local_840 = local_6a0.MinAngle;
        }
        else {
          local_840 = u_f * (local_6a0.MaxAngle - local_6a0.MinAngle) + local_6a0.MinAngle;
        }
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        uVar15 = -(uint)(local_840 == 0.0) & 1;
        iVar3 = (int)((local_840 * 116000.0) / (local_6a0.MaxAngle - local_6a0.MinAngle));
        if (0x1c51f < iVar3) {
          iVar3 = 0x1c520;
        }
        if (iVar3 < 1) {
          iVar3 = 0;
        }
        local_840 = local_840 * 116000.0;
        iVar4 = SetMotorRelativeIM483I(&local_6a0,-iVar3,uVar15);
        iVar3 = local_848;
        if (iVar4 != 0) {
          iVar4 = 6;
          do {
            iVar4 = iVar4 + -1;
            if (iVar4 == 0) {
              puts("Connection to a IM483I lost.");
              bSailCalibrated = 0;
              iVar4 = CloseRS232Port(&local_6a0.RS232Port);
              iVar3 = local_848;
              if (iVar4 == 0) {
                pcVar14 = "IM483I disconnected.";
              }
              else {
                pcVar14 = "IM483I disconnection failed.";
              }
              puts(pcVar14);
              goto LAB_001ca43c;
            }
            local_858.tv_sec = (long)local_6a0.timeout / 1000;
            local_858.tv_nsec = ((long)local_6a0.timeout % 1000) * 1000000;
            nanosleep(&local_858,(timespec *)0x0);
            iVar3 = (int)(local_840 / (local_6a0.MaxAngle - local_6a0.MinAngle));
            if (0x1c51f < iVar3) {
              iVar3 = 0x1c520;
            }
            if (iVar3 < 1) {
              iVar3 = 0;
            }
            iVar5 = SetMotorRelativeIM483I(&local_6a0,-iVar3,uVar15);
            iVar3 = local_848;
          } while (iVar5 != 0);
        }
      }
      bVar2 = false;
    }
    else {
      iVar5 = ConnectIM483I(&local_6a0,"IM483I0.txt");
      iVar3 = local_6a0.threadperiod;
      if (iVar5 == 0) {
        bSailCalibrated = 0;
        if ((FILE *)local_6a0.pfSaveFile != (FILE *)0x0) {
          fclose((FILE *)local_6a0.pfSaveFile);
          local_6a0.pfSaveFile = (FILE *)0x0;
        }
        bVar2 = false;
        bVar1 = true;
        if ((local_6a0.bSaveRawData != 0) && ((FILE *)local_6a0.pfSaveFile == (FILE *)0x0)) {
          if (local_6a0.szCfgFilePath[0] == '\0') {
            builtin_strncpy(local_7a8,"im483i",7);
          }
          else {
            sprintf(local_7a8,"%.127s",local_6a0.szCfgFilePath);
          }
          sVar7 = strlen(local_7a8);
          uVar15 = (uint)sVar7;
          uVar13 = sVar7 & 0xffffffff;
          uVar8 = (int)uVar15 >> 0x1f & uVar15;
          uVar12 = sVar7 & 0xffffffff;
          do {
            uVar13 = uVar13 - 1;
            uVar11 = (uint)uVar12;
            uVar12 = (ulong)(uVar8 - 1);
            uVar9 = uVar8;
            if ((int)uVar11 < 1) break;
            uVar12 = (ulong)(uVar11 - 1);
            uVar9 = uVar11;
          } while (local_7a8[uVar13 & 0xffffffff] != '.');
          if ((int)uVar9 <= (int)uVar15 && 1 < (int)uVar9) {
            memset(local_7a8 + uVar12,0,sVar7 - uVar12);
          }
          pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
          pcVar14 = strtimeex_fns();
          sprintf(local_138,"log/%.127s_%.64s.txt",local_7a8,pcVar14);
          bVar2 = false;
          pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
          local_6a0.pfSaveFile = (FILE *)fopen(local_138,"wb");
          if ((FILE *)local_6a0.pfSaveFile == (FILE *)0x0) {
            puts("Unable to create IM483I data file.");
            bVar2 = false;
            goto LAB_001ca58a;
          }
        }
      }
      else {
        local_858.tv_sec = 1;
        local_858.tv_nsec = 0;
        nanosleep(&local_858,(timespec *)0x0);
        iVar3 = iVar4;
LAB_001ca43c:
        bVar1 = false;
        bVar2 = true;
      }
    }
LAB_001ca448:
    if ((bVar2) &&
       (local_844 = local_844 + 1, ExitOnErrorCount <= local_844 && 0 < ExitOnErrorCount)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001ca58a:
      if (local_7b0 == 0) {
        clock_gettime(4,&local_858);
        local_7e0 = local_858.tv_sec;
        lStack_7d8 = local_858.tv_nsec;
        local_858.tv_sec =
             (local_858.tv_sec + local_7d0 + (local_858.tv_nsec + lStack_7c8) / 1000000000) -
             local_7f0.tv_sec;
        local_858.tv_nsec = (local_858.tv_nsec + lStack_7c8) % 1000000000 - local_7f0.tv_nsec;
        if (local_858.tv_nsec < 0) {
          local_858.tv_sec = local_858.tv_sec + local_858.tv_nsec / 1000000000 + -1;
          local_858.tv_nsec = local_858.tv_nsec % 1000000000 + 1000000000;
        }
        local_7d0 = local_858.tv_sec;
        lStack_7c8 = local_858.tv_nsec;
      }
      if (local_7f8 == 0) {
        clock_gettime(4,&local_858);
        local_828 = local_858.tv_sec;
        lStack_820 = local_858.tv_nsec;
        local_858.tv_sec =
             (local_858.tv_sec + local_818 + (local_858.tv_nsec + lStack_810) / 1000000000) -
             local_838.tv_sec;
        local_858.tv_nsec = (local_858.tv_nsec + lStack_810) % 1000000000 - local_838.tv_nsec;
        if (local_858.tv_nsec < 0) {
          local_858.tv_sec = local_858.tv_sec + local_858.tv_nsec / 1000000000 + -1;
          local_858.tv_nsec = local_858.tv_nsec % 1000000000 + 1000000000;
        }
        local_818 = local_858.tv_sec;
        lStack_810 = local_858.tv_nsec;
      }
      if ((FILE *)local_6a0.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_6a0.pfSaveFile);
        local_6a0.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar2) {
        iVar3 = CloseRS232Port(&local_6a0.RS232Port);
        pcVar14 = "IM483I disconnection failed.";
        if (iVar3 == 0) {
          pcVar14 = "IM483I disconnected.";
        }
        puts(pcVar14);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE IM483IThread(void* pParam)
{
	IM483I im483i;
	double angle = 0;
	CHRONO chrono_sail_calibration;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&im483i, 0, sizeof(IM483I));

	StartChrono(&chrono_sail_calibration);

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseIM483I) 
		{
			if (bConnected)
			{
				printf("IM483I paused.\n");
				bConnected = FALSE;
				DisconnectIM483I(&im483i);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartIM483I) 
		{
			if (bConnected)
			{
				printf("Restarting a IM483I.\n");
				bConnected = FALSE;
				DisconnectIM483I(&im483i);
			}
			bRestartIM483I = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectIM483I(&im483i, "IM483I0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = im483i.threadperiod;

				//EnterCriticalSection(&StateVariablesCS);
				bSailCalibrated = FALSE;
				//LeaveCriticalSection(&StateVariablesCS);

				if (im483i.pfSaveFile != NULL)
				{
					fclose(im483i.pfSaveFile); 
					im483i.pfSaveFile = NULL;
				}
				if ((im483i.bSaveRawData)&&(im483i.pfSaveFile == NULL)) 
				{
					if (strlen(im483i.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", im483i.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "im483i");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					im483i.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (im483i.pfSaveFile == NULL) 
					{
						printf("Unable to create IM483I data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			switch (robid)
			{
			case SAILBOAT_ROBID: // For VSim compatibility...
			case SAILBOAT2_ROBID: // For VSim compatibility...
			case VAIMOS_ROBID:
				if ((GetTimeElapsedChronoQuick(&chrono_sail_calibration) > sail_calibration_period)||
					((bCalibrateSail)&&(!bSailCalibrated))||
					(bForceSailCalibration))
				{
					if ((bCalibrateSail)&&(!bSailCalibrated))
					{
						if (bCheckRudder) mSleep(7000); // Wait for the rudder check...
					}
					bSailCalibrated = FALSE;
					if (CalibrateMotorIM483I(&im483i) != EXIT_SUCCESS)
					{
						printf("Connection to a IM483I lost.\n");
						bSailCalibrated = FALSE;
						bConnected = FALSE;
						DisconnectIM483I(&im483i);
						break;
					}
					bSailCalibrated = TRUE;
					bForceSailCalibration = FALSE;
					StopChronoQuick(&chrono_sail_calibration);
					StartChrono(&chrono_sail_calibration);
				}
				EnterCriticalSection(&StateVariablesCS);
				//angle = deltasmax;
				if (u_f > 0) angle = u_f*(im483i.MaxAngle-im483i.MinAngle)+im483i.MinAngle; else angle = im483i.MinAngle;
				LeaveCriticalSection(&StateVariablesCS);
				//if ((!im483i.bNoContinuousUpdateMaxAngle)||(bUpdateMaxAngleIM483I)) { ... bUpdateMaxAngleIM483I = FALSE; }
				i = 0;
				while (SetMaxAngleIM483I(&im483i, angle) != EXIT_SUCCESS)
				{
					if (i > 4)
					{
						printf("Connection to a IM483I lost.\n");
						bSailCalibrated = FALSE;
						bConnected = FALSE;
						DisconnectIM483I(&im483i);
						break;
					}
					mSleep(im483i.timeout);
					i++;
				}
				break;
			default:
				break;
			}
		}

		//printf("IM483IThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	StopChronoQuick(&chrono_sail_calibration);

	if (im483i.pfSaveFile != NULL)
	{
		fclose(im483i.pfSaveFile); 
		im483i.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectIM483I(&im483i);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}